

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O2

void Nwk_ManGraphPrepare(Nwk_Grf_t *p)

{
  size_t __size;
  size_t __size_00;
  int iVar1;
  int iVar2;
  int iVar3;
  Nwk_Edg_t *pNVar4;
  int *__s;
  int *piVar5;
  ulong uVar6;
  long lVar7;
  void *__ptr;
  Aig_MmFlex_t *pAVar8;
  Nwk_Vrt_t **ppNVar9;
  Nwk_Vrt_t *pNVar10;
  long lVar11;
  Nwk_Edg_t **ppNVar12;
  ulong uVar13;
  int iVar14;
  
  iVar1 = p->nObjs;
  __size = (long)iVar1 * 4 + 4;
  __s = (int *)malloc(__size);
  p->pMapLut2Id = __s;
  __size_00 = (long)p->nVertsMax * 4 + 4;
  piVar5 = (int *)malloc(__size_00);
  p->pMapId2Lut = piVar5;
  memset(__s,0xff,__size);
  memset(piVar5,0xff,__size_00);
  uVar6 = 0;
  uVar13 = (ulong)(uint)p->nEdgeHash;
  if (p->nEdgeHash < 1) {
    uVar13 = uVar6;
  }
  for (; uVar6 != uVar13; uVar6 = uVar6 + 1) {
    ppNVar12 = p->pEdgeHash + uVar6;
    while (pNVar4 = *ppNVar12, pNVar4 != (Nwk_Edg_t *)0x0) {
      if (iVar1 < pNVar4->iNode1) {
        __assert_fail("pEntry->iNode1 <= p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMerge.c"
                      ,0x121,"void Nwk_ManGraphPrepare(Nwk_Grf_t *)");
      }
      if (iVar1 < pNVar4->iNode2) {
        __assert_fail("pEntry->iNode2 <= p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMerge.c"
                      ,0x122,"void Nwk_ManGraphPrepare(Nwk_Grf_t *)");
      }
      __s[pNVar4->iNode1] = 0;
      __s[pNVar4->iNode2] = 0;
      ppNVar12 = &pNVar4->pNext;
    }
  }
  p->nVerts = 0;
  iVar14 = 0;
  for (lVar7 = 0; lVar7 <= iVar1; lVar7 = lVar7 + 1) {
    if (__s[lVar7] == 0) {
      lVar11 = (long)iVar14;
      iVar14 = iVar14 + 1;
      p->nVerts = iVar14;
      __s[lVar7] = iVar14;
      piVar5[lVar11 + 1] = (int)lVar7;
    }
  }
  __ptr = calloc((long)(iVar14 + 1),4);
  uVar6 = 0;
  do {
    if (uVar6 == uVar13) {
      pAVar8 = Aig_MmFlexStart();
      p->pMemVerts = pAVar8;
      uVar13 = (ulong)p->nVerts;
      ppNVar9 = (Nwk_Vrt_t **)malloc(uVar13 * 8 + 8);
      p->pVerts = ppNVar9;
      *ppNVar9 = (Nwk_Vrt_t *)0x0;
      lVar7 = 1;
      while( true ) {
        if ((int)uVar13 < lVar7) {
          for (lVar7 = 0; lVar7 < p->nEdgeHash; lVar7 = lVar7 + 1) {
            ppNVar12 = p->pEdgeHash + lVar7;
            while (pNVar4 = *ppNVar12, pNVar4 != (Nwk_Edg_t *)0x0) {
              pNVar10 = ppNVar9[pNVar4->iNode1];
              iVar1 = pNVar4->iNode2;
              iVar14 = pNVar10->nEdges;
              pNVar10->nEdges = iVar14 + 1;
              (&pNVar10[1].Id)[iVar14] = iVar1;
              pNVar10 = ppNVar9[iVar1];
              iVar1 = pNVar4->iNode1;
              iVar14 = pNVar10->nEdges;
              pNVar10->nEdges = iVar14 + 1;
              (&pNVar10[1].Id)[iVar14] = iVar1;
              ppNVar12 = &pNVar4->pNext;
            }
          }
          lVar7 = 1;
          while( true ) {
            if (p->nVerts < lVar7) {
              Aig_MmFixedStop(p->pMemEdges,0);
              p->pMemEdges = (Aig_MmFixed_t *)0x0;
              if (p->pEdgeHash != (Nwk_Edg_t **)0x0) {
                free(p->pEdgeHash);
                p->pEdgeHash = (Nwk_Edg_t **)0x0;
              }
              free(__ptr);
              return;
            }
            if (p->pVerts[lVar7]->nEdges != *(int *)((long)__ptr + lVar7 * 4)) break;
            Nwk_ManGraphListInsert(p,p->pVerts[lVar7]);
            lVar7 = lVar7 + 1;
          }
          __assert_fail("p->pVerts[i]->nEdges == pnEdges[i]",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMerge.c"
                        ,0x156,"void Nwk_ManGraphPrepare(Nwk_Grf_t *)");
        }
        iVar1 = *(int *)((long)__ptr + lVar7 * 4);
        if (iVar1 < 1) break;
        iVar1 = iVar1 * 4 + 0x10;
        pNVar10 = (Nwk_Vrt_t *)Aig_MmFlexEntryFetch(p->pMemVerts,iVar1);
        p->pVerts[lVar7] = pNVar10;
        memset(p->pVerts[lVar7],0,(long)iVar1);
        ppNVar9 = p->pVerts;
        ppNVar9[lVar7]->Id = (int)lVar7;
        lVar7 = lVar7 + 1;
        uVar13 = (ulong)(uint)p->nVerts;
      }
      __assert_fail("pnEdges[i] > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMerge.c"
                    ,0x145,"void Nwk_ManGraphPrepare(Nwk_Grf_t *)");
    }
    ppNVar12 = p->pEdgeHash + uVar6;
    while (pNVar4 = *ppNVar12, pNVar4 != (Nwk_Edg_t *)0x0) {
      if (iVar1 < pNVar4->iNode1) {
        __assert_fail("pEntry->iNode1 <= p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMerge.c"
                      ,0x135,"void Nwk_ManGraphPrepare(Nwk_Grf_t *)");
      }
      if (iVar1 < pNVar4->iNode2) {
        __assert_fail("pEntry->iNode2 <= p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMerge.c"
                      ,0x136,"void Nwk_ManGraphPrepare(Nwk_Grf_t *)");
      }
      iVar2 = __s[pNVar4->iNode1];
      pNVar4->iNode1 = iVar2;
      iVar3 = __s[pNVar4->iNode2];
      pNVar4->iNode2 = iVar3;
      if (iVar14 < iVar2) {
        __assert_fail("pEntry->iNode1 <= p->nVerts",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMerge.c"
                      ,0x13a,"void Nwk_ManGraphPrepare(Nwk_Grf_t *)");
      }
      if (iVar14 < iVar3) {
        __assert_fail("pEntry->iNode2 <= p->nVerts",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMerge.c"
                      ,0x13b,"void Nwk_ManGraphPrepare(Nwk_Grf_t *)");
      }
      piVar5 = (int *)((long)__ptr + (long)iVar2 * 4);
      *piVar5 = *piVar5 + 1;
      piVar5 = (int *)((long)__ptr + (long)iVar3 * 4);
      *piVar5 = *piVar5 + 1;
      ppNVar12 = &pNVar4->pNext;
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void Nwk_ManGraphPrepare( Nwk_Grf_t * p )
{
    Nwk_Edg_t * pEntry;
    Nwk_Vrt_t * pVertex;
    int * pnEdges, nBytes, i;
    // allocate memory for the present objects
    p->pMapLut2Id = ABC_ALLOC( int, p->nObjs+1 );
    p->pMapId2Lut = ABC_ALLOC( int, p->nVertsMax+1 );
    memset( p->pMapLut2Id, 0xff, sizeof(int) * (p->nObjs+1) );
    memset( p->pMapId2Lut, 0xff, sizeof(int) * (p->nVertsMax+1) );
    // mark present objects
    Nwk_GraphForEachEdge( p, pEntry, i )
    {
        assert( pEntry->iNode1 <= p->nObjs );
        assert( pEntry->iNode2 <= p->nObjs );
        p->pMapLut2Id[ pEntry->iNode1 ] = 0;
        p->pMapLut2Id[ pEntry->iNode2 ] = 0;
    }
    // map objects
    p->nVerts = 0;
    for ( i = 0; i <= p->nObjs; i++ )
    {
        if ( p->pMapLut2Id[i] == 0 )
        {
            p->pMapLut2Id[i] = ++p->nVerts;
            p->pMapId2Lut[p->nVerts] = i;
        }
    }
    // count the edges and mark present objects
    pnEdges = ABC_CALLOC( int, p->nVerts+1 );
    Nwk_GraphForEachEdge( p, pEntry, i )
    {
        // translate into vertices
        assert( pEntry->iNode1 <= p->nObjs );
        assert( pEntry->iNode2 <= p->nObjs );
        pEntry->iNode1 = p->pMapLut2Id[pEntry->iNode1];
        pEntry->iNode2 = p->pMapLut2Id[pEntry->iNode2];
        // count the edges
        assert( pEntry->iNode1 <= p->nVerts );
        assert( pEntry->iNode2 <= p->nVerts );
        pnEdges[pEntry->iNode1]++;
        pnEdges[pEntry->iNode2]++;
    }
    // allocate the real graph
    p->pMemVerts  = Aig_MmFlexStart();
    p->pVerts = ABC_ALLOC( Nwk_Vrt_t *, p->nVerts + 1 );
    p->pVerts[0] = NULL;
    for ( i = 1; i <= p->nVerts; i++ )
    {
        assert( pnEdges[i] > 0 );
        nBytes = sizeof(Nwk_Vrt_t) + sizeof(int) * pnEdges[i];
        p->pVerts[i] = (Nwk_Vrt_t *)Aig_MmFlexEntryFetch( p->pMemVerts, nBytes );
        memset( p->pVerts[i], 0, nBytes );
        p->pVerts[i]->Id = i;
    }
    // add edges to the real graph
    Nwk_GraphForEachEdge( p, pEntry, i )
    {
        pVertex = p->pVerts[pEntry->iNode1];
        pVertex->pEdges[ pVertex->nEdges++ ] = pEntry->iNode2;
        pVertex = p->pVerts[pEntry->iNode2];
        pVertex->pEdges[ pVertex->nEdges++ ] = pEntry->iNode1;
    }
    // put vertices into the data structure
    for ( i = 1; i <= p->nVerts; i++ )
    {
        assert( p->pVerts[i]->nEdges == pnEdges[i] );
        Nwk_ManGraphListInsert( p, p->pVerts[i] );
    }
    // clean up
    Aig_MmFixedStop( p->pMemEdges, 0 ); p->pMemEdges = NULL;
    ABC_FREE( p->pEdgeHash );
//    p->nEdgeHash = 0;
    ABC_FREE( pnEdges );
}